

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall
QGraphicsViewPrivate::populateSceneDragDropEvent
          (QGraphicsViewPrivate *this,QGraphicsSceneDragDropEvent *dest,QDropEvent *source)

{
  bool bVar1;
  QPoint QVar2;
  QWidget *pQVar3;
  QWidget *source_00;
  long in_FS_OFFSET;
  double dVar4;
  QPoint local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QWidget **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  dVar4 = (double)((ulong)*(double *)(source + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(source + 0x10);
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  local_50.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  dVar4 = (double)((ulong)*(double *)(source + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(source + 0x18);
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  local_50.yp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  local_48 = QGraphicsView::mapToScene((QGraphicsView *)pQVar3,&local_50);
  QGraphicsSceneDragDropEvent::setScenePos(dest,&local_48);
  dVar4 = (double)((ulong)*(double *)(source + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(source + 0x10);
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  local_50.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  dVar4 = (double)((ulong)*(double *)(source + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(source + 0x18);
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  local_50.yp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  QVar2 = QWidget::mapToGlobal(pQVar3,&local_50);
  local_48.xp = (qreal)QVar2;
  QGraphicsSceneDragDropEvent::setScreenPos(dest,(QPoint *)&local_48);
  QGraphicsSceneDragDropEvent::setButtons
            (dest,(QFlagsStorageHelper<Qt::MouseButton,_4>)
                  *(QFlagsStorage<Qt::MouseButton> *)(source + 0x20));
  QGraphicsSceneDragDropEvent::setModifiers
            (dest,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                  *(QFlagsStorage<Qt::KeyboardModifier> *)(source + 0x24));
  QGraphicsSceneDragDropEvent::setPossibleActions
            (dest,(QFlagsStorageHelper<Qt::DropAction,_4>)
                  *(QFlagsStorage<Qt::DropAction> *)(source + 0x28));
  QGraphicsSceneDragDropEvent::setProposedAction(dest,*(DropAction *)(source + 0x30));
  QGraphicsSceneDragDropEvent::setDropAction(dest,*(DropAction *)(source + 0x2c));
  QGraphicsSceneDragDropEvent::setMimeData(dest,*(QMimeData **)(source + 0x38));
  QGraphicsSceneEvent::setWidget
            (&dest->super_QGraphicsSceneEvent,(this->super_QAbstractScrollAreaPrivate).viewport);
  pQVar3 = (QWidget *)QDropEvent::source();
  if (pQVar3 == (QWidget *)0x0) {
    source_00 = (QWidget *)0x0;
  }
  else {
    source_00 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
      source_00 = pQVar3;
    }
  }
  QGraphicsSceneDragDropEvent::setSource(dest,source_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::populateSceneDragDropEvent(QGraphicsSceneDragDropEvent *dest,
                                                      QDropEvent *source)
{
#if QT_CONFIG(draganddrop)
    Q_Q(QGraphicsView);
    dest->setScenePos(q->mapToScene(source->position().toPoint()));
    dest->setScreenPos(q->mapToGlobal(source->position().toPoint()));
    dest->setButtons(source->buttons());
    dest->setModifiers(source->modifiers());
    dest->setPossibleActions(source->possibleActions());
    dest->setProposedAction(source->proposedAction());
    dest->setDropAction(source->dropAction());
    dest->setMimeData(source->mimeData());
    dest->setWidget(viewport);
    dest->setSource(qobject_cast<QWidget *>(source->source()));
#else
    Q_UNUSED(dest);
    Q_UNUSED(source);
#endif
}